

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int map_set(pMap map,size_t key,void *value)

{
  size_t sVar1;
  size_t sVar2;
  size_t *psVar3;
  void *pvVar4;
  
  sVar1 = map->count;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      if (map->keys[sVar2] == key) {
        memcpy((void *)(sVar2 * map->value_size + (long)map->values),value,map->value_size);
        return 1;
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  psVar3 = (size_t *)realloc(map->keys,sVar1 * 8 + 8);
  if (psVar3 != (size_t *)0x0) {
    pvVar4 = realloc(map->values,map->value_size * (sVar1 + 1));
    if (pvVar4 != (void *)0x0) {
      psVar3[sVar1] = key;
      memcpy((void *)(sVar1 * map->value_size + (long)pvVar4),value,map->value_size);
      map->count = sVar1 + 1;
      map->keys = psVar3;
      map->values = pvVar4;
      return 0;
    }
  }
  perror("map_set: realloc failed");
  return -1;
}

Assistant:

int map_set(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(map->values + i * map->value_size, value, map->value_size);
            return MAP_EXISTS;
        }
    }
    size_t index = map->count;
    size_t count = index + 1;
    size_t *keys = realloc(map->keys, count * sizeof(size_t));
    if (keys == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }

    void *values = realloc(map->values, count * map->value_size);
    if (values == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }
    keys[index] = key;
    memcpy(values + index * map->value_size, value, map->value_size);

    map->count = count;
    map->keys = keys;
    map->values = values;
    return MAP_SUCCESS;
}